

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaShrink6.c
# Opt level: O0

void Shr_ManAddFanout(Shr_Man_t *p,int iFanin,int iFanout)

{
  Vec_Int_t *p_00;
  int iVar1;
  int Entry;
  anon_union_8_2_51278640 FanStr;
  int iFanout_local;
  int iFanin_local;
  Shr_Man_t *p_local;
  
  iVar1 = Vec_IntEntry(p->vObj2Fan,iFanin);
  p_00 = p->vObj2Fan;
  Entry = Vec_WrdSize(p->vFanMem);
  Vec_IntWriteEntry(p_00,iFanin,Entry);
  Vec_WrdPush(p->vFanMem,CONCAT44(iVar1,iFanout));
  return;
}

Assistant:

static inline void Shr_ManAddFanout( Shr_Man_t * p, int iFanin, int iFanout )
{
    union {
        Shr_Fan_t sFan;
        word      sWord;
    } FanStr;
    FanStr.sFan.iFan = iFanout;
    FanStr.sFan.Next = Vec_IntEntry(p->vObj2Fan, iFanin);
    Vec_IntWriteEntry( p->vObj2Fan, iFanin, Vec_WrdSize(p->vFanMem) );
    Vec_WrdPush(p->vFanMem, FanStr.sWord );
}